

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QMdiSubWindow::setOption(QMdiSubWindow *this,SubWindowOption option,bool on)

{
  QWidget *this_00;
  long lVar1;
  SubWindowOption SVar2;
  undefined3 in_register_00000011;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (CONCAT31(in_register_00000011,on) == 0) {
    SVar2 = ~option & *(SubWindowOption *)(lVar1 + 0x388);
  }
  else {
    SVar2 = *(SubWindowOption *)(lVar1 + 0x388) | option;
  }
  *(SubWindowOption *)(lVar1 + 0x388) = SVar2;
  if (((option & (RubberBandMove|RubberBandResize)) != 0 && !on) &&
     (*(char *)(lVar1 + 0x2d3) == '\x01')) {
    this_00 = *(QWidget **)(lVar1 + 8);
    QWidget::releaseMouse(this_00);
    *(undefined1 *)(lVar1 + 0x2d3) = 0;
    QWidget::setGeometry(this_00,(QRect *)(*(long *)(*(long *)(lVar1 + 0x298) + 0x20) + 0x14));
    QWidget::hide(*(QWidget **)(lVar1 + 0x298));
    *(undefined4 *)(lVar1 + 0x2ec) = 0;
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }